

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anmmap.c
# Opt level: O2

int set(state_t *state,int linenum,seqmap_entry_t *ent)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  char *__format;
  seqmap_t *map;
  byte *str;
  char **kwp;
  undefined8 *puVar5;
  stringref_t ref;
  
  if (state->ident == 0) {
    map = state->smap;
    if ((map != state->amap->gvar_types) ||
       ((str = (byte *)ent->value, (*str & 0xfe) == 0x24 && (str[1] == 0)))) {
LAB_0010e724:
      seqmap_set(map,ent);
      return 0;
    }
    pcVar4 = state->fn;
    __format = "%s:%s:%u: unknown type \'%s\'\n";
  }
  else {
    str = (byte *)ent->value;
    bVar2 = *str;
    if ((bVar2 == 0) || (pbVar1 = str, (byte)(bVar2 - 0x30) < 10)) {
LAB_0010e738:
      pcVar4 = state->fn;
      __format = "%s:%s:%u: \'%s\' isn\'t valid identifier\n";
    }
    else {
      while (bVar2 != 0) {
        if ((0x19 < (byte)(bVar2 + 0x9f) && 9 < (byte)(bVar2 - 0x30)) &&
           (bVar2 != 0x5f && 0x19 < (byte)(bVar2 + 0xbf))) goto LAB_0010e738;
        bVar2 = pbVar1[1];
        pbVar1 = pbVar1 + 1;
      }
      ref.len = 4;
      ref.str = "ins_";
      iVar3 = util_strcmp_ref((char *)str,ref);
      if (iVar3 == 0) {
        fprintf(_stderr,"%s:%s:%u: mnemonic can\'t start with \'ins_\'\n",argv0,state->fn,linenum);
        return 1;
      }
      puVar5 = &is_keyword_keywords;
      do {
        pcVar4 = (char *)*puVar5;
        if (pcVar4 == (char *)0x0) {
          map = state->smap;
          goto LAB_0010e724;
        }
        puVar5 = puVar5 + 1;
        iVar3 = strcmp((char *)str,pcVar4);
      } while (iVar3 != 0);
      pcVar4 = state->fn;
      __format = "%s:%s:%u: \'%s\' is a keyword, ignoring\n";
    }
  }
  fprintf(_stderr,__format,argv0,pcVar4,linenum,str);
  return 1;
}

Assistant:

static int
set(
    state_t* state,
    int linenum,
    const seqmap_entry_t* ent
) {
    if (state->ident) {
        if (validate_ident(state, linenum, ent->value))
            return 1;
    } else if (state->smap == state->amap->gvar_types) {
        if (validate_type(state, linenum, ent->value))
            return 1;
    }
    seqmap_set(state->smap, ent);
    return 0;
}